

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

Var Js::JavascriptRegExp::EntryGetterDotAll(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DynamicObject *pDVar5;
  JavascriptRegExp *pJVar6;
  JavascriptBoolean *pJVar7;
  JavascriptLibrary *pJVar8;
  int in_stack_00000010;
  CallInfo local_38;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x425,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d07c0f;
    *puVar4 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_38);
  if (((ulong)local_38 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x425,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00d07c0f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  bVar3 = ShouldApplyPrototypeWebWorkaround((Arguments *)&callInfo_local,pSVar1);
  if (bVar3) {
    pJVar8 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  }
  else {
    pDVar5 = (DynamicObject *)Arguments::operator[]((Arguments *)&callInfo_local,0);
    pJVar8 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
    if (pDVar5 != (pJVar8->super_JavascriptLibraryBase).regexPrototype.ptr) {
      pJVar6 = GetJavascriptRegExp((Arguments *)&callInfo_local,L"RegExp.prototype.dotAll",pSVar1);
      pJVar8 = (((pJVar6->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
               ptr;
      bVar3 = UnifiedRegex::RegexPattern::IsDotAll((pJVar6->pattern).ptr);
      pJVar7 = JavascriptLibrary::CreateBoolean(pJVar8,(uint)bVar3);
      return pJVar7;
    }
  }
  return (pJVar8->super_JavascriptLibraryBase).undefinedValue.ptr;
}

Assistant:

JavascriptRegExp * JavascriptRegExp::BoxStackInstance(JavascriptRegExp * instance, bool deepCopy)
    {
        Assert(ThreadContext::IsOnStack(instance));
        // On the stack, the we reserved a pointer before the object as to store the boxed value
        JavascriptRegExp ** boxedInstanceRef = ((JavascriptRegExp **)instance) - 1;
        JavascriptRegExp * boxedInstance = *boxedInstanceRef;
        if (boxedInstance)
        {
            return boxedInstance;
        }
        Assert(instance->GetTypeHandler()->GetInlineSlotsSize() == 0);
        boxedInstance = RecyclerNew(instance->GetRecycler(), JavascriptRegExp, instance, deepCopy);
        *boxedInstanceRef = boxedInstance;
        return boxedInstance;
    }